

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

int get_regulated_q_overshoot
              (AV1_COMP *cpi,int is_encode_stage,int q_low,int q_high,int top_index,int bottom_index
              )

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  AV1_COMP *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  AV1_COMP *in_stack_00000010;
  int retries;
  int q_regulated;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  undefined8 in_stack_ffffffffffffffa0;
  int height;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  AV1_COMP *cpi_00;
  int local_38;
  int local_34;
  
  height = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  av1_rc_update_rate_correction_factors
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  if (in_R8D < in_ECX) {
    in_R8D = in_ECX;
  }
  cpi_00 = in_RDI;
  local_34 = av1_rc_regulate_q(in_RDI,in_R8D,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                               in_stack_ffffffffffffffa8,height);
  local_38 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb0 & 0xffffff;
    if (local_34 < in_EDX) {
      uVar1 = CONCAT13(local_38 < 10,(int3)in_stack_ffffffffffffffb0);
    }
    in_stack_ffffffffffffffb0 = uVar1;
    if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
    av1_rc_update_rate_correction_factors
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    local_34 = av1_rc_regulate_q(cpi_00,in_R8D,in_stack_ffffffffffffffb0,in_R9D,
                                 (in_RDI->rc).this_frame_target,(int)((ulong)in_RDI >> 0x20));
    local_38 = local_38 + 1;
  }
  return local_34;
}

Assistant:

static inline int get_regulated_q_overshoot(AV1_COMP *const cpi,
                                            int is_encode_stage, int q_low,
                                            int q_high, int top_index,
                                            int bottom_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;

  av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                        cm->height);

  int q_regulated =
      av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                        AOMMAX(q_high, top_index), cm->width, cm->height);

  int retries = 0;
  while (q_regulated < q_low && retries < 10) {
    av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                          cm->height);
    q_regulated =
        av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                          AOMMAX(q_high, top_index), cm->width, cm->height);
    retries++;
  }
  return q_regulated;
}